

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test::
CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test
          (CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test =
       (_func_int **)
       &
       PTR__CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test_009ee338
  ;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(5);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(10), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);

  EXPECT_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)), CfdException);
}